

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O0

void __thiscall Projector::DisplayCurrentSlice(Projector *this)

{
  double v1;
  double in_RDI;
  Point pt;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  Mat *in_stack_ffffffffffffff18;
  allocator *paVar3;
  _InputOutputArray *in_stack_ffffffffffffff20;
  _InputArray local_c8;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [32];
  Point_<int> local_68;
  undefined1 local_60 [28];
  Point_<int> local_44 [3];
  allocator local_29;
  string local_28 [40];
  
  paVar3 = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Current Image",paVar3);
  cv::namedWindow(local_28,0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  cv::Point_<int>::Point_(local_44,0,0);
  cv::_InputOutputArray::_InputOutputArray(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  v1 = (double)((long)in_RDI + 8);
  cv::Point_<int>::Point_(&local_68,0x1e,0x1e);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)paVar3,in_RDI,v1,(double)in_stack_ffffffffffffff18,
             (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  uVar2 = 0;
  uVar1 = 8;
  cv::putText(0x4000000000000000,local_60,v1,&local_68,5,local_88,1);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x10b86d);
  paVar3 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Current Image",paVar3);
  cv::_InputArray::_InputArray
            ((_InputArray *)CONCAT44(in_stack_ffffffffffffff14,uVar2),
             (Mat *)CONCAT44(in_stack_ffffffffffffff0c,uVar1));
  cv::imshow(local_a8,&local_c8);
  cv::_InputArray::~_InputArray(&local_c8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cv::waitKey(20000);
  return;
}

Assistant:

void Projector::DisplayCurrentSlice()
{
	//Displays the current image on an openCV window

	namedWindow("Current Image", WINDOW_NORMAL);
	cv::Point pt = Point(0,0);
	putText(CurrentImage, CurrentImageLoc, Point(30,30), FONT_HERSHEY_COMPLEX_SMALL, 2, Scalar(255, 255, 255), 1, 8, false);
	imshow("Current Image", CurrentImage);
	waitKey(20000);

}